

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

MultiplyLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_multiply(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xe7) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xe7;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    MultiplyLayerParams::MultiplyLayerParams(this_00.multiply_);
    (this->layer_).multiply_ = (MultiplyLayerParams *)this_00;
  }
  return (MultiplyLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::MultiplyLayerParams* NeuralNetworkLayer::mutable_multiply() {
  if (!has_multiply()) {
    clear_layer();
    set_has_multiply();
    layer_.multiply_ = new ::CoreML::Specification::MultiplyLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.multiply)
  return layer_.multiply_;
}